

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O3

int16_t WebRtcIsac_DecodeInterpolLpcUb
                  (Bitstr *streamdata,double *percepFilterParams,int16_t bandwidth)

{
  int16_t iVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  double *percepFilterParams_00;
  long lVar5;
  double percepFilterGains [12];
  double lpcCoeff [16];
  double local_118 [12];
  double local_b8 [17];
  
  pdVar3 = local_b8;
  iVar2 = WebRtcIsac_DecodeLpcCoefUB(streamdata,pdVar3,local_118,bandwidth);
  if (iVar2 < 0) {
    iVar1 = -0x1a18;
  }
  else {
    if (bandwidth == 0xc) {
      lVar5 = 6;
      iVar2 = 5;
      lVar4 = 1;
    }
    else {
      if (bandwidth != 0x10) {
        return -1;
      }
      lVar5 = 0xc;
      iVar2 = 4;
      lVar4 = 3;
    }
    percepFilterParams_00 = percepFilterParams;
    do {
      WebRtcIsac_Lar2PolyInterpolUB(pdVar3,percepFilterParams_00,iVar2 + 1);
      pdVar3 = pdVar3 + 4;
      percepFilterParams_00 =
           (double *)((long)percepFilterParams_00 + (ulong)(uint)(iVar2 << 3) * 5);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    pdVar3 = percepFilterParams + 5;
    if (bandwidth != 0x10) {
      pdVar3 = percepFilterParams;
    }
    lVar4 = 0;
    do {
      *pdVar3 = local_118[lVar4];
      pdVar3 = pdVar3 + 5;
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int16_t WebRtcIsac_DecodeInterpolLpcUb(Bitstr* streamdata,
                                       double* percepFilterParams,
                                       int16_t bandwidth) {
  double lpcCoeff[UB_LPC_ORDER * UB16_LPC_VEC_PER_FRAME];
  int err;
  int interpolCntr;
  int subframeCntr;
  int16_t numSegments;
  int16_t numVecPerSegment;
  int16_t numGains;

  double percepFilterGains[SUBFRAMES << 1];
  double* ptrOutParam = percepFilterParams;

  err = WebRtcIsac_DecodeLpcCoefUB(streamdata, lpcCoeff, percepFilterGains,
                                   bandwidth);
  if (err < 0) {
    return -ISAC_RANGE_ERROR_DECODE_LPC;
  }

  switch (bandwidth) {
    case isac12kHz: {
      numGains = SUBFRAMES;
      numSegments = UB_LPC_VEC_PER_FRAME - 1;
      numVecPerSegment = kLpcVecPerSegmentUb12;
      break;
    }
    case isac16kHz: {
      numGains = SUBFRAMES << 1;
      numSegments = UB16_LPC_VEC_PER_FRAME - 1;
      numVecPerSegment = kLpcVecPerSegmentUb16;
      break;
    }
    default:
      return -1;
  }

  for (interpolCntr = 0; interpolCntr < numSegments; interpolCntr++) {
    WebRtcIsac_Lar2PolyInterpolUB(&lpcCoeff[interpolCntr * UB_LPC_ORDER],
                                  ptrOutParam, numVecPerSegment + 1);
    ptrOutParam += (numVecPerSegment * (UB_LPC_ORDER + 1));
  }

  ptrOutParam = percepFilterParams;

  if (bandwidth == isac16kHz) {
    ptrOutParam += (1 + UB_LPC_ORDER);
  }

  for (subframeCntr = 0; subframeCntr < numGains; subframeCntr++) {
    *ptrOutParam = percepFilterGains[subframeCntr];
    ptrOutParam += (1 + UB_LPC_ORDER);
  }
  return 0;
}